

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_executor_state.cpp
# Opt level: O2

ClientContext * __thiscall duckdb::ExpressionState::GetContext(ExpressionState *this)

{
  ExpressionExecutor *this_00;
  ClientContext *pCVar1;
  BinderException *this_01;
  BoundFunctionExpression *pBVar2;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  this_00 = this->root->executor;
  if ((this_00->context).ptr != (ClientContext *)0x0) {
    pCVar1 = ExpressionExecutor::GetContext(this_00);
    return pCVar1;
  }
  this_01 = (BinderException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_38,"Cannot use %s in this context",&local_59);
  pBVar2 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&this->expr->super_BaseExpression);
  ::std::__cxx11::string::string
            ((string *)&local_58,
             (string *)
             &(pBVar2->function).super_BaseScalarFunction.super_SimpleFunction.super_Function.name);
  BinderException::BinderException<std::__cxx11::string>(this_01,&local_38,&local_58);
  __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

ClientContext &ExpressionState::GetContext() {
	if (!HasContext()) {
		throw BinderException("Cannot use %s in this context", (expr.Cast<BoundFunctionExpression>()).function.name);
	}
	return root.executor->GetContext();
}